

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O2

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> __thiscall
duckdb::PropagateSimpleDatePartStatistics<0l,60000l>
          (duckdb *this,vector<duckdb::BaseStatistics,_true> *child_stats)

{
  Value aVStack_c8 [64];
  LogicalType local_88 [24];
  BaseStatistics result;
  
  duckdb::LogicalType::LogicalType(local_88,BIGINT);
  duckdb::NumericStats::CreateEmpty(&result);
  duckdb::LogicalType::~LogicalType(local_88);
  vector<duckdb::BaseStatistics,_true>::get<true>(child_stats,0);
  duckdb::BaseStatistics::CopyValidity(&result);
  duckdb::Value::BIGINT((long)aVStack_c8);
  duckdb::NumericStats::SetMin(&result,aVStack_c8);
  duckdb::Value::~Value(aVStack_c8);
  duckdb::Value::BIGINT((long)aVStack_c8);
  duckdb::NumericStats::SetMax(&result,aVStack_c8);
  duckdb::Value::~Value(aVStack_c8);
  duckdb::BaseStatistics::ToUnique();
  duckdb::BaseStatistics::~BaseStatistics(&result);
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)this;
}

Assistant:

static unique_ptr<BaseStatistics> PropagateSimpleDatePartStatistics(vector<BaseStatistics> &child_stats) {
	// we can always propagate simple date part statistics
	// since the min and max can never exceed these bounds
	auto result = NumericStats::CreateEmpty(LogicalType::BIGINT);
	result.CopyValidity(child_stats[0]);
	NumericStats::SetMin(result, Value::BIGINT(MIN));
	NumericStats::SetMax(result, Value::BIGINT(MAX));
	return result.ToUnique();
}